

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O0

void __thiscall llama_vocab::impl::impl(impl *this,llama_vocab *vocab)

{
  unique_ptr<llm_tokenizer,_std::default_delete<llm_tokenizer>_> *in_RSI;
  undefined4 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[1] = 1;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 1;
  in_RDI[5] = 2;
  in_RDI[6] = 0xffffffff;
  in_RDI[7] = 0xffffffff;
  in_RDI[8] = 0;
  in_RDI[9] = 0xffffffff;
  in_RDI[10] = 0xffffffff;
  in_RDI[0xb] = 0xffffffff;
  in_RDI[0xc] = 0xd;
  in_RDI[0xd] = 0xffffffff;
  in_RDI[0xe] = 0xffffffff;
  in_RDI[0xf] = 0xffffffff;
  in_RDI[0x10] = 0xffffffff;
  in_RDI[0x11] = 0xffffffff;
  in_RDI[0x12] = 0xffffffff;
  *(undefined1 *)(in_RDI + 0x13) = 0;
  *(undefined1 *)((long)in_RDI + 0x4d) = 0;
  *(undefined1 *)((long)in_RDI + 0x4e) = 0;
  *(undefined1 *)((long)in_RDI + 0x4f) = 0;
  *(undefined1 *)(in_RDI + 0x14) = 0;
  *(undefined1 *)((long)in_RDI + 0x51) = 0;
  *(undefined1 *)((long)in_RDI + 0x52) = 1;
  *(undefined1 *)((long)in_RDI + 0x53) = 0;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)0x541d84);
  std::vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>::vector
            ((vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_> *)0x541d94);
  ::std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x541da4);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x541db4);
  std::
  unordered_map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_llama_vocab::impl::pair_hash,_std::equal_to<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
  ::unordered_map((unordered_map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int,_llama_vocab::impl::pair_hash,_std::equal_to<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_int>_>_>
                   *)0x541dc4);
  ::std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x541dd4);
  ::std::unique_ptr<llm_tokenizer,std::default_delete<llm_tokenizer>>::
  unique_ptr<std::default_delete<llm_tokenizer>,void>(in_RSI);
  ::std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)0x541df4);
  *(unique_ptr<llm_tokenizer,_std::default_delete<llm_tokenizer>_> **)(in_RDI + 0x58) = in_RSI;
  return;
}

Assistant:

impl(const llama_vocab & vocab) : vocab(vocab) {
    }